

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreRenderTarget.h
# Opt level: O1

void __thiscall
irr::video::
COpenGLCoreRenderTarget<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
::setTextures(COpenGLCoreRenderTarget<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
              *this,ITexture **textures,u32 numTextures,ITexture *depthStencil,
             E_CUBE_SURFACE *cubeSurfaces,u32 numCubeSurfaces)

{
  array<irr::video::ITexture_*> *__x;
  array<irr::video::E_CUBE_SURFACE> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  code *pcVar2;
  _func_int *p_Var3;
  E_DRIVER_TYPE EVar4;
  pointer ppIVar5;
  pointer pEVar6;
  _func_int *p_Var7;
  int iVar8;
  pointer pEVar9;
  ulong uVar10;
  ITexture *pIVar11;
  dimension2d<unsigned_int> *pdVar12;
  ulong uVar13;
  size_t __n;
  E_CUBE_SURFACE *pEVar14;
  pointer ppIVar15;
  ITexture *pIVar16;
  char *this_01;
  bool bVar17;
  bool bVar18;
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  double __x_00;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  array<irr::video::ITexture_*> prevTextures;
  stringc message;
  vector<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_> local_70;
  undefined1 local_58;
  string<char> local_50;
  undefined4 extraout_var;
  
  ppIVar15 = (this->super_IRenderTarget).Textures.m_data.
             super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppIVar5 = (this->super_IRenderTarget).Textures.m_data.
            super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  __n = (long)ppIVar5 - (long)ppIVar15;
  uVar10 = (ulong)numCubeSurfaces;
  if (((long)__n >> 3 == (ulong)numTextures) &&
     ((ppIVar5 == ppIVar15 ||
      (iVar8 = bcmp(ppIVar15,textures,__n), in_XMM0_Qa = extraout_XMM0_Qa, iVar8 == 0)))) {
    pEVar9 = (this->super_IRenderTarget).CubeSurfaces.m_data.
             super__Vector_base<irr::video::E_CUBE_SURFACE,_std::allocator<irr::video::E_CUBE_SURFACE>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pEVar6 = (this->super_IRenderTarget).CubeSurfaces.m_data.
             super__Vector_base<irr::video::E_CUBE_SURFACE,_std::allocator<irr::video::E_CUBE_SURFACE>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((long)pEVar6 - (long)pEVar9 >> 2 != uVar10) goto LAB_001eb363;
    bVar17 = pEVar9 == pEVar6;
    if (!bVar17) {
      pEVar14 = cubeSurfaces;
      if (*pEVar9 == *cubeSurfaces) {
        do {
          pEVar14 = pEVar14 + 1;
          pEVar9 = pEVar9 + 1;
          bVar17 = pEVar9 == pEVar6;
          if (bVar17) goto LAB_001eb352;
        } while (*pEVar9 == *pEVar14);
      }
      goto LAB_001eb363;
    }
LAB_001eb352:
    if (!bVar17) goto LAB_001eb363;
    bVar17 = false;
  }
  else {
LAB_001eb363:
    __x = &(this->super_IRenderTarget).Textures;
    std::vector<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>::vector
              (&local_70,&__x->m_data);
    local_58 = (this->super_IRenderTarget).Textures.is_sorted;
    if (this->ColorAttachment < numTextures) {
      paVar1 = &local_50.str.field_2;
      local_50.str._M_string_length = 0;
      local_50.str.field_2._M_local_buf[0] = '\0';
      local_50.str._M_dataplus._M_p = (pointer)paVar1;
      core::string<char>::operator=(&local_50,"This GPU supports up to ");
      core::string<char>::operator+=(&local_50,this->ColorAttachment);
      __x_00 = (double)::std::__cxx11::string::append((char *)&local_50,0x232a16);
      os::Printer::log((Printer *)local_50.str._M_dataplus._M_p,__x_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50.str._M_dataplus._M_p != paVar1) {
        operator_delete(local_50.str._M_dataplus._M_p,
                        CONCAT71(local_50.str.field_2._M_allocated_capacity._1_7_,
                                 local_50.str.field_2._M_local_buf[0]) + 1);
      }
    }
    if (this->ColorAttachment < numTextures) {
      numTextures = this->ColorAttachment;
    }
    std::vector<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>::resize
              (&__x->m_data,(ulong)numTextures);
    ppIVar15 = (this->super_IRenderTarget).Textures.m_data.
               super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (((long)(this->super_IRenderTarget).Textures.m_data.
               super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
               _M_impl.super__Vector_impl_data._M_finish - (long)ppIVar15 & 0x7fffffff8U) != 0) {
      EVar4 = (this->super_IRenderTarget).DriverType;
      uVar13 = 0;
      do {
        pIVar11 = textures[uVar13];
        if (pIVar11 == (ITexture *)0x0) {
          pIVar16 = (ITexture *)0x0;
        }
        else {
          pIVar16 = (ITexture *)0x0;
          if (pIVar11->DriverType == EVar4) {
            pIVar16 = pIVar11;
          }
        }
        if ((pIVar16 == (ITexture *)0x0) || (*(int *)&pIVar16->field_0x84 == 0)) {
          ppIVar15[uVar13] = (ITexture *)0x0;
        }
        else {
          ppIVar15[uVar13] = pIVar11;
          pIVar11 = (__x->m_data).
                    super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar13];
          pcVar2 = (code *)((long)&(pIVar11->NamedPath).Path.str._M_string_length +
                           (long)pIVar11->_vptr_ITexture[0xfffffffffffffffd]);
          *(int *)pcVar2 = *(int *)pcVar2 + 1;
        }
        uVar13 = uVar13 + 1;
        ppIVar15 = (this->super_IRenderTarget).Textures.m_data.
                   super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar13 < ((ulong)((long)(this->super_IRenderTarget).Textures.m_data.
                                       super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar15)
                         >> 3 & 0xffffffff));
    }
    in_XMM0_Qa = extraout_XMM0_Qa_00;
    if (((long)local_70.
               super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)local_70.
               super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
               _M_impl.super__Vector_impl_data._M_start & 0x7fffffff8U) != 0) {
      uVar13 = 0;
      do {
        pIVar11 = local_70.
                  super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar13];
        if (pIVar11 != (ITexture *)0x0) {
          p_Var7 = pIVar11->_vptr_ITexture[-3];
          p_Var3 = (_func_int *)
                   ((long)&(pIVar11->NamedPath).Path.str._M_string_length + (long)p_Var7);
          *(int *)p_Var3 = *(int *)p_Var3 + -1;
          if (*(int *)p_Var3 == 0) {
            in_XMM0_Qa = (double)(**(code **)(*(long *)((long)&pIVar11->_vptr_ITexture +
                                                       (long)p_Var7) + 8))();
          }
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < ((ulong)((long)local_70.
                                       super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_70.
                                      super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff))
      ;
    }
    this->RequestTextureUpdate = true;
    if (local_70.super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.
                      super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_70.
                            super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.
                            super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      in_XMM0_Qa = extraout_XMM0_Qa_01;
    }
    bVar17 = true;
  }
  pEVar9 = (this->super_IRenderTarget).CubeSurfaces.m_data.
           super__Vector_base<irr::video::E_CUBE_SURFACE,_std::allocator<irr::video::E_CUBE_SURFACE>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar6 = (this->super_IRenderTarget).CubeSurfaces.m_data.
           super__Vector_base<irr::video::E_CUBE_SURFACE,_std::allocator<irr::video::E_CUBE_SURFACE>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((long)pEVar6 - (long)pEVar9 >> 2 == uVar10) {
    bVar18 = pEVar9 == pEVar6;
    if (!bVar18) {
      pEVar14 = cubeSurfaces;
      if (*pEVar9 == *cubeSurfaces) {
        do {
          pEVar14 = pEVar14 + 1;
          pEVar9 = pEVar9 + 1;
          bVar18 = pEVar9 == pEVar6;
          if (bVar18) goto LAB_001eb562;
        } while (*pEVar9 == *pEVar14);
      }
      goto LAB_001eb567;
    }
LAB_001eb562:
    if (!bVar18) goto LAB_001eb567;
  }
  else {
LAB_001eb567:
    this_00 = &(this->super_IRenderTarget).CubeSurfaces;
    std::vector<irr::video::E_CUBE_SURFACE,_std::allocator<irr::video::E_CUBE_SURFACE>_>::resize
              (&this_00->m_data,uVar10);
    in_XMM0_Qa = extraout_XMM0_Qa_02;
    if (numCubeSurfaces != 0) {
      memmove((this_00->m_data).
              super__Vector_base<irr::video::E_CUBE_SURFACE,_std::allocator<irr::video::E_CUBE_SURFACE>_>
              ._M_impl.super__Vector_impl_data._M_start,cubeSurfaces,uVar10 << 2);
      in_XMM0_Qa = extraout_XMM0_Qa_03;
    }
    (this->super_IRenderTarget).CubeSurfaces.is_sorted = false;
    this->RequestTextureUpdate = true;
  }
  pIVar11 = (this->super_IRenderTarget).DepthStencil;
  if (pIVar11 == depthStencil) {
    if (!bVar17) {
      return;
    }
    goto LAB_001eb635;
  }
  if (pIVar11 != (ITexture *)0x0) {
    p_Var7 = pIVar11->_vptr_ITexture[-3];
    p_Var3 = (_func_int *)((long)&(pIVar11->NamedPath).Path.str._M_string_length + (long)p_Var7);
    *(int *)p_Var3 = *(int *)p_Var3 + -1;
    if (*(int *)p_Var3 == 0) {
      in_XMM0_Qa = (double)(**(code **)(*(long *)((long)&pIVar11->_vptr_ITexture + (long)p_Var7) + 8
                                       ))();
    }
    (this->super_IRenderTarget).DepthStencil = (ITexture *)0x0;
  }
  if (depthStencil == (ITexture *)0x0) {
    pIVar11 = (ITexture *)0x0;
  }
  else {
    pIVar11 = (ITexture *)0x0;
    if (depthStencil->DriverType == (this->super_IRenderTarget).DriverType) {
      pIVar11 = depthStencil;
    }
  }
  if (pIVar11 != (ITexture *)0x0) {
    if (pIVar11->Type == ETT_2D) {
      if ((*(int *)&pIVar11->field_0x84 != 0) && (depthStencil->ColorFormat - ECF_D16 < 3)) {
        (this->super_IRenderTarget).DepthStencil = depthStencil;
        p_Var3 = (_func_int *)
                 ((long)&(depthStencil->NamedPath).Path.str._M_string_length +
                 (long)depthStencil->_vptr_ITexture[-3]);
        *(int *)p_Var3 = *(int *)p_Var3 + 1;
        goto LAB_001eb631;
      }
      this_01 = "Ignoring depth/stencil texture without depth color format.";
    }
    else {
      this_01 = "This driver doesn\'t support depth/stencil to cubemaps.";
    }
    os::Printer::log((Printer *)this_01,in_XMM0_Qa);
  }
LAB_001eb631:
  this->RequestDepthStencilUpdate = true;
LAB_001eb635:
  ppIVar15 = (this->super_IRenderTarget).Textures.m_data.
             super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  uVar10 = (long)(this->super_IRenderTarget).Textures.m_data.
                 super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar15;
  if ((uVar10 & 0x7fffffff8) != 0) {
    uVar13 = 0;
    do {
      pIVar11 = ppIVar15[uVar13];
      if (pIVar11 != (ITexture *)0x0) goto LAB_001eb660;
      uVar13 = uVar13 + 1;
    } while ((uVar10 >> 3 & 0xffffffff) != uVar13);
  }
  pIVar11 = (ITexture *)0x0;
LAB_001eb660:
  if ((pIVar11 == (ITexture *)0x0) &&
     (pIVar11 = (this->super_IRenderTarget).DepthStencil, pIVar11 == (ITexture *)0x0)) {
    iVar8 = (*(this->Driver->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x3b])();
    pdVar12 = (dimension2d<unsigned_int> *)CONCAT44(extraout_var,iVar8);
  }
  else {
    pdVar12 = &pIVar11->Size;
  }
  this->Size = *pdVar12;
  return;
}

Assistant:

void setTextures(ITexture *const *textures, u32 numTextures, ITexture *depthStencil, const E_CUBE_SURFACE *cubeSurfaces, u32 numCubeSurfaces) override
	{
		bool needSizeUpdate = false;

		// Set color attachments.
		if (!Textures.equals(textures, numTextures) || !CubeSurfaces.equals(cubeSurfaces, numCubeSurfaces)) {
			needSizeUpdate = true;

			core::array<ITexture *> prevTextures(Textures);

			if (numTextures > static_cast<u32>(ColorAttachment)) {
				core::stringc message = "This GPU supports up to ";
				message += static_cast<u32>(ColorAttachment);
				message += " textures per render target.";

				os::Printer::log(message.c_str(), ELL_WARNING);
			}

			Textures.set_used(core::min_(numTextures, static_cast<u32>(ColorAttachment)));

			for (u32 i = 0; i < Textures.size(); ++i) {
				TOpenGLTexture *currentTexture = (textures[i] && textures[i]->getDriverType() == DriverType) ? static_cast<TOpenGLTexture *>(textures[i]) : 0;

				GLuint textureID = 0;

				if (currentTexture) {
					textureID = currentTexture->getOpenGLTextureName();
				}

				if (textureID != 0) {
					Textures[i] = textures[i];
					Textures[i]->grab();
				} else {
					Textures[i] = 0;
				}
			}

			for (u32 i = 0; i < prevTextures.size(); ++i) {
				if (prevTextures[i])
					prevTextures[i]->drop();
			}

			RequestTextureUpdate = true;
		}

		if (!CubeSurfaces.equals(cubeSurfaces, numCubeSurfaces)) {
			CubeSurfaces.set_data(cubeSurfaces, numCubeSurfaces);
			RequestTextureUpdate = true;
		}

		// Set depth and stencil attachments.
		if (DepthStencil != depthStencil) {
			if (DepthStencil) {
				DepthStencil->drop();
				DepthStencil = 0;
			}

			needSizeUpdate = true;
			TOpenGLTexture *currentTexture = (depthStencil && depthStencil->getDriverType() == DriverType) ? static_cast<TOpenGLTexture *>(depthStencil) : 0;

			if (currentTexture) {
				if (currentTexture->getType() == ETT_2D) {
					GLuint textureID = currentTexture->getOpenGLTextureName();

					const ECOLOR_FORMAT textureFormat = (textureID != 0) ? depthStencil->getColorFormat() : ECF_UNKNOWN;
					if (IImage::isDepthFormat(textureFormat)) {
						DepthStencil = depthStencil;
						DepthStencil->grab();
					} else {
						os::Printer::log("Ignoring depth/stencil texture without depth color format.", ELL_WARNING);
					}
				} else {
					os::Printer::log("This driver doesn't support depth/stencil to cubemaps.", ELL_WARNING);
				}
			}

			RequestDepthStencilUpdate = true;
		}

		if (needSizeUpdate) {
			// Set size required for a viewport.

			ITexture *firstTexture = getTexture();

			if (firstTexture)
				Size = firstTexture->getSize();
			else {
				if (DepthStencil)
					Size = DepthStencil->getSize();
				else
					Size = Driver->getScreenSize();
			}
		}
	}